

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmwrtimg.cpp
# Opt level: O0

void __thiscall CVmImageWriter::write_meta_dep_item(CVmImageWriter *this,char *metaclass_name)

{
  long lVar1;
  CVmImageWriter *in_RSI;
  char *in_RDI;
  CVmImageWriter *unaff_retaddr;
  char *nm;
  
  nm = in_RDI;
  end_meta_prop_list(in_RSI);
  lVar1 = CVmFile::get_pos((CVmFile *)in_RSI);
  *(long *)(in_RDI + 0x18) = lVar1;
  CVmFile::write_uint2((CVmFile *)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  write_dep_block_item(unaff_retaddr,nm);
  lVar1 = CVmFile::get_pos((CVmFile *)in_RSI);
  *(long *)(in_RDI + 0x20) = lVar1;
  CVmFile::write_uint2((CVmFile *)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  CVmFile::write_uint2((CVmFile *)in_RSI,(uint)((ulong)in_RDI >> 0x20));
  in_RDI[0x28] = '\0';
  in_RDI[0x29] = '\0';
  in_RDI[0x2a] = '\0';
  in_RDI[0x2b] = '\0';
  return;
}

Assistant:

void CVmImageWriter::write_meta_dep_item(const char *metaclass_name)
{
    /* if we didn't end the previous item's property list, end it now */
    end_meta_prop_list();

    /* write a placeholder next record offset */
    mcld_ofs_pos_ = fp_->get_pos();
    fp_->write_uint2(0);
    
    /* write the metaclass name */
    write_dep_block_item(metaclass_name);

    /* write a placeholder property vector count */
    mcld_propcnt_pos_ = fp_->get_pos();
    fp_->write_uint2(0);

    /* write the property record size (2 bytes) */
    fp_->write_uint2(2);

    /* no properties yet */
    mcld_prop_cnt_ = 0;
}